

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::VideoTrack::SetColour(VideoTrack *this,Colour *colour)

{
  Colour *this_00;
  uint64_t uVar1;
  unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> uVar2;
  bool bVar3;
  pointer __p;
  unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> colour_ptr;
  
  colour_ptr._M_t.super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>.
  _M_t.super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
  super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl =
       (__uniq_ptr_data<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>,_true,_true>)
       operator_new(0x70);
  *(undefined4 *)
   colour_ptr._M_t.super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>.
   _M_t.super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
   super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 4) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 8) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0xc) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x10) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x14) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x18) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x1c) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x20) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x24) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x28) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x2c) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x30) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x34) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x38) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x3c) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x40) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x44) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x48) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x4c) = 0xffffffff;
  *(uint64_t *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x60) = 0xffffffffffffffff
  ;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x50) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x54) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x58) = 0xffffffff;
  *(undefined4 *)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x5c) = 0xffffffff;
  *(MasteringMetadata **)
   ((long)colour_ptr._M_t.
          super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
          super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x68) =
       (MasteringMetadata *)0x0;
  if ((colour->mastering_metadata_ == (MasteringMetadata *)0x0) ||
     (bVar3 = Colour::SetMasteringMetadata
                        ((Colour *)
                         colour_ptr._M_t.
                         super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>
                         .super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl,
                         colour->mastering_metadata_), bVar3)) {
    uVar2._M_t.super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
    super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
    super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl =
         colour_ptr._M_t.
         super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
         super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
         super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl;
    uVar1 = colour->bits_per_channel_;
    *(uint64_t *)
     colour_ptr._M_t.super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>
     ._M_t.super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
     super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl = colour->matrix_coefficients_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 8) = uVar1;
    uVar1 = colour->chroma_subsampling_vert_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x10) =
         colour->chroma_subsampling_horz_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x18) = uVar1;
    uVar1 = colour->cb_subsampling_vert_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x20) =
         colour->cb_subsampling_horz_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x28) = uVar1;
    uVar1 = colour->chroma_siting_vert_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x30) =
         colour->chroma_siting_horz_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x38) = uVar1;
    uVar1 = colour->transfer_characteristics_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x40) = colour->range_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x48) = uVar1;
    uVar1 = colour->max_cll_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x50) =
         colour->primaries_;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x58) = uVar1;
    *(uint64_t *)
     ((long)colour_ptr._M_t.
            super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>._M_t.
            super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
            super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl + 0x60) =
         colour->max_fall_;
    this_00 = this->colour_;
    if (this_00 != (Colour *)0x0) {
      Colour::~Colour(this_00);
    }
    operator_delete(this_00);
    colour_ptr._M_t.super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>.
    _M_t.super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
    super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>,_true,_true>)
         (__uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>)0x0;
    this->colour_ =
         (Colour *)
         uVar2._M_t.super___uniq_ptr_impl<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>.
         _M_t.super__Tuple_impl<0UL,_mkvmuxer::Colour_*,_std::default_delete<mkvmuxer::Colour>_>.
         super__Head_base<0UL,_mkvmuxer::Colour_*,_false>._M_head_impl;
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::~unique_ptr
            (&colour_ptr);
  return bVar3;
}

Assistant:

bool VideoTrack::SetColour(const Colour& colour) {
  std::unique_ptr<Colour> colour_ptr(new Colour());
  if (!colour_ptr.get())
    return false;

  if (colour.mastering_metadata()) {
    if (!colour_ptr->SetMasteringMetadata(*colour.mastering_metadata()))
      return false;
  }

  colour_ptr->set_matrix_coefficients(colour.matrix_coefficients());
  colour_ptr->set_bits_per_channel(colour.bits_per_channel());
  colour_ptr->set_chroma_subsampling_horz(colour.chroma_subsampling_horz());
  colour_ptr->set_chroma_subsampling_vert(colour.chroma_subsampling_vert());
  colour_ptr->set_cb_subsampling_horz(colour.cb_subsampling_horz());
  colour_ptr->set_cb_subsampling_vert(colour.cb_subsampling_vert());
  colour_ptr->set_chroma_siting_horz(colour.chroma_siting_horz());
  colour_ptr->set_chroma_siting_vert(colour.chroma_siting_vert());
  colour_ptr->set_range(colour.range());
  colour_ptr->set_transfer_characteristics(colour.transfer_characteristics());
  colour_ptr->set_primaries(colour.primaries());
  colour_ptr->set_max_cll(colour.max_cll());
  colour_ptr->set_max_fall(colour.max_fall());
  delete colour_;
  colour_ = colour_ptr.release();
  return true;
}